

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::erase
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          string_view_type *key)

{
  byte bVar1;
  object *this_00;
  not_an_object *this_01;
  
  for (; bVar1 = (byte)*(object_storage *)this & 0xf, bVar1 == 9;
      this = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              ((long)this + 8)) {
  }
  if (bVar1 != 4) {
    if (bVar1 == 0xd) {
      this_00 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                object_storage::value_abi_cxx11_((object_storage *)this);
      order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
      ::erase(this_00,key);
      return;
    }
    this_01 = (not_an_object *)__cxa_allocate_exception(0x58);
    not_an_object::not_an_object<char>(this_01,key->_M_str,key->_M_len);
    __cxa_throw(this_01,&not_an_object::typeinfo,not_an_object::~not_an_object);
  }
  return;
}

Assistant:

void erase(const string_view_type& key)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    break;
                case json_storage_kind::object:
                    cast<object_storage>().value().erase(key);
                    break;
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().erase(key);
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }